

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32i386.c
# Opt level: O1

Symbol * aros_lnksym(GlobalVars *gv,Section *sec,Reloc *xref)

{
  int iVar1;
  Symbol *pSVar2;
  Symbol *pSVar3;
  
  if ((gv->dest_object == 0) && (gv->use_ldscript == 0)) {
    iVar1 = strcmp(linkerdb,xref->xrefname);
    if (iVar1 == 0) {
      pSVar2 = addlnksymbol(gv,linkerdb,(long)fff[gv->dest_format]->baseoff,'\x02','\x01','\x01',
                            '\x02',0);
      pSVar2->extra = 0x80000000;
      pSVar3 = findlnksymbol(gv,"_SDA_BASE_");
      if (pSVar3 == (Symbol *)0x0) {
        pSVar3 = addlnksymbol(gv,"_SDA_BASE_",(long)fff[gv->dest_format]->baseoff,'\x01','\x01',
                              '\x01','\x02',0);
        pSVar3->type = '\x02';
        pSVar3->extra = 0;
      }
      return pSVar2;
    }
  }
  pSVar2 = elf_lnksym(gv,sec,xref);
  return pSVar2;
}

Assistant:

static struct Symbol *aros_lnksym(struct GlobalVars *gv,struct Section *sec,
                                  struct Reloc *xref)
{
  struct Symbol *sym;

  if (!gv->dest_object && !gv->use_ldscript) {
    if (!strcmp(linkerdb,xref->xrefname)) {  /* _LinkerDB */
      sym = addlnksymbol(gv,linkerdb,(lword)fff[gv->dest_format]->baseoff,
                         SYM_RELOC,SYMF_LNKSYM,SYMI_OBJECT,SYMB_GLOBAL,0);
      sym->extra = SYMX_SPECIAL|LINKERDB;
      if (findlnksymbol(gv,sdabase_name) == NULL) {
        /* Reference to _LinkerDB creates _SDA_BASE_ */
        struct Symbol *sdabase = addlnksymbol(gv,sdabase_name,
                                              (lword)fff[gv->dest_format]->baseoff,
                                              SYM_ABS,SYMF_LNKSYM,
                                              SYMI_OBJECT,SYMB_GLOBAL,0);
        sdabase->type = SYM_RELOC;
        sdabase->extra = SDABASE;
      }
      return sym;  /* new linker symbol created */
    }
  }

  return elf_lnksym(gv,sec,xref);
}